

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O0

xmlChar * getAttribute(xmlNodePtr node,xmlChar *name)

{
  int iVar1;
  xmlChar *pxVar2;
  undefined8 in_RSI;
  long in_RDI;
  xmlAttr *attr;
  long local_20;
  
  local_20 = *(long *)(in_RDI + 0x58);
  while( true ) {
    if (local_20 == 0) {
      return (xmlChar *)0x0;
    }
    iVar1 = xmlStrEqual(*(undefined8 *)(local_20 + 0x10),in_RSI);
    if (iVar1 != 0) break;
    local_20 = *(long *)(local_20 + 0x30);
  }
  pxVar2 = (xmlChar *)xmlNodeGetContent(local_20);
  return pxVar2;
}

Assistant:

static xmlChar* getAttribute(xmlNodePtr node, const xmlChar* name) {
    xmlAttr *attr = node->properties;
    while (attr) {
        if (xmlStrEqual(attr->name, name)) {
            return xmlNodeGetContent((xmlNode*)attr);
        }
        attr = attr->next;
    }

    return NULL;
}